

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall Assimp::PretransformVertices::PretransformVertices(PretransformVertices *this)

{
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__PretransformVertices_0082bc88;
  this->configKeepHierarchy = false;
  this->configNormalize = false;
  this->configTransform = false;
  (this->configTransformation).a1 = 1.0;
  (this->configTransformation).a2 = 0.0;
  (this->configTransformation).a3 = 0.0;
  (this->configTransformation).a4 = 0.0;
  (this->configTransformation).b1 = 0.0;
  (this->configTransformation).b2 = 1.0;
  (this->configTransformation).b3 = 0.0;
  (this->configTransformation).b4 = 0.0;
  (this->configTransformation).c1 = 0.0;
  (this->configTransformation).c2 = 0.0;
  (this->configTransformation).c3 = 1.0;
  (this->configTransformation).c4 = 0.0;
  (this->configTransformation).d1 = 0.0;
  (this->configTransformation).d2 = 0.0;
  (this->configTransformation).d3 = 0.0;
  (this->configTransformation).d4 = 1.0;
  this->mConfigPointCloud = false;
  return;
}

Assistant:

PretransformVertices::PretransformVertices() :
		configKeepHierarchy(false),
		configNormalize(false),
		configTransform(false),
		configTransformation(),
		mConfigPointCloud(false) {
	// empty
}